

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O0

SUNMatrix SUNMatClone(SUNMatrix A)

{
  SUNMatrix p_Var1;
  long in_RDI;
  SUNMatrix B;
  
  p_Var1 = (SUNMatrix)(**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI);
  p_Var1->sunctx = *(SUNContext *)(in_RDI + 0x10);
  return p_Var1;
}

Assistant:

SUNMatrix SUNMatClone(SUNMatrix A)
{
  SUNMatrix B = NULL;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(A));
  B = A->ops->clone(A);
  B->sunctx = A->sunctx;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(A));
  return(B);
}